

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mio.c
# Opt level: O3

int Mio_CommandPrintGenlib(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  FILE *pFile;
  int iVar2;
  FILE *__s;
  void *pvVar3;
  Mio_Library_t *pLib;
  char *pcVar4;
  uint fShort;
  char *pcVar5;
  uint local_34;
  
  Abc_FrameReadOut(pAbc);
  __s = (FILE *)Abc_FrameReadErr(pAbc);
  fShort = 0;
  Extra_UtilGetoptReset();
  local_34 = 0;
  bVar1 = false;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"savh"), iVar2 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 == -1) break;
    if (iVar2 == 0x61) {
      local_34 = local_34 ^ 1;
    }
    else {
      if (iVar2 != 0x73) {
        fwrite("\nusage: print_genlib [-savh]\n",0x1d,1,__s);
        fwrite("\t          print the current genlib library\n",0x2c,1,__s);
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (fShort == 0) {
          pcVar4 = "no";
        }
        fprintf(__s,"\t-s      : toggles writing short form [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_34 == 0) {
          pcVar4 = "no";
        }
        fprintf(__s,"\t-a      : toggles writing min-area gates [default = %s]\n",pcVar4);
        if (!bVar1) {
          pcVar5 = "no";
        }
        fprintf(__s,"\t-v      : toggles enabling of verbose output [default = %s]\n",pcVar5);
        fwrite("\t-h      : print the command usage\n",0x23,1,__s);
        return 1;
      }
      fShort = fShort ^ 1;
    }
  }
  pvVar3 = Abc_FrameReadLibGen();
  pFile = _stdout;
  if (pvVar3 == (void *)0x0) {
    puts("Library is not available.");
    return 1;
  }
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  Mio_WriteLibrary(pFile,pLib,0,fShort,local_34);
  return 0;
}

Assistant:

int Mio_CommandPrintGenlib( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pOut, * pErr;
    int fShort = 0;
    int fSelected = 0;
    int fVerbose = 0;
    int c;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "savh")) != EOF ) 
    {
        switch (c) 
        {
            case 's':
                fShort ^= 1;
                break;
            case 'a':
                fSelected ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }
    if ( Abc_FrameReadLibGen() == NULL )
    {
        printf( "Library is not available.\n" );
        return 1;
    }
    Mio_WriteLibrary( stdout, (Mio_Library_t *)Abc_FrameReadLibGen(), 0, fShort, fSelected );
    return 0;

usage:
    fprintf( pErr, "\nusage: print_genlib [-savh]\n");
    fprintf( pErr, "\t          print the current genlib library\n" );  
    fprintf( pErr, "\t-s      : toggles writing short form [default = %s]\n", fShort? "yes" : "no" );
    fprintf( pErr, "\t-a      : toggles writing min-area gates [default = %s]\n", fSelected? "yes" : "no" );
    fprintf( pErr, "\t-v      : toggles enabling of verbose output [default = %s]\n", fVerbose? "yes" : "no" );
    fprintf( pErr, "\t-h      : print the command usage\n");
    return 1;       
}